

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O2

bool Pl_Flate::zopfli_check_env(QPDFLogger *logger)

{
  bool bVar1;
  runtime_error *this;
  bool bVar2;
  allocator<char> local_59;
  string value;
  string local_38;
  
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"QPDF_ZOPFLI",&local_59);
  bVar1 = QUtil::get_env(&local_38,&value);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = true;
  if (bVar1) {
    bVar1 = std::operator==(&value,"disabled");
    if (!bVar1) {
      bVar1 = std::operator==(&value,"silent");
      if (!bVar1) {
        if (logger == (QPDFLogger *)0x0) {
          QPDFLogger::defaultLogger();
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
          logger = (QPDFLogger *)local_38._M_dataplus._M_p;
        }
        bVar1 = std::operator==(&value,"force");
        if (bVar1) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,"QPDF_ZOPFLI=force, and zopfli support is not enabled");
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        QPDFLogger::warn(logger,
                         "QPDF_ZOPFLI is set, but libqpdf was not built with zopfli support\n");
        QPDFLogger::warn(logger,
                         "Set QPDF_ZOPFLI=silent to suppress this warning and use zopfli when available.\n"
                        );
        bVar2 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&value);
  return bVar2;
}

Assistant:

bool
Pl_Flate::zopfli_check_env(QPDFLogger* logger)
{
    if (Pl_Flate::zopfli_supported()) {
        return true;
    }
    std::string value;
    auto is_set = QUtil::get_env("QPDF_ZOPFLI", &value);
    if (!is_set || value == "disabled" || value == "silent") {
        return true;
    }
    if (!logger) {
        logger = QPDFLogger::defaultLogger().get();
    }

    // This behavior is known in QPDFJob (for the --zopfli argument), Pl_Flate.hh, README.md,
    // and the manual. Do a case-insensitive search for zopfli if changing the behavior.
    if (value == "force") {
        throw std::runtime_error("QPDF_ZOPFLI=force, and zopfli support is not enabled");
    }
    logger->warn("QPDF_ZOPFLI is set, but libqpdf was not built with zopfli support\n");
    logger->warn(
        "Set QPDF_ZOPFLI=silent to suppress this warning and use zopfli when available.\n");
    return false;
}